

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

_Bool small_mempool_can_be_deactivated(small_mempool *small_mempool)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t mask;
  uint32_t idx;
  small_mempool *small_mempool_local;
  
  uVar1 = small_mempool_get_group_index(small_mempool);
  if ((small_mempool->group->active_pool_mask & 1 << ((byte)uVar1 & 0x1f)) == 0) {
    small_mempool_local._7_1_ = false;
  }
  else {
    sVar2 = mempool_count(&small_mempool->pool);
    if (sVar2 == 0) {
      if (small_mempool->waste < small_mempool->group->waste_max >> 2) {
        if (small_mempool == small_mempool->group->last) {
          small_mempool_local._7_1_ = false;
        }
        else {
          small_mempool_local._7_1_ = true;
        }
      }
      else {
        small_mempool_local._7_1_ = false;
      }
    }
    else {
      small_mempool_local._7_1_ = false;
    }
  }
  return small_mempool_local._7_1_;
}

Assistant:

static inline bool
small_mempool_can_be_deactivated(struct small_mempool *small_mempool)
{
	uint32_t idx = small_mempool_get_group_index(small_mempool);
	uint32_t mask = small_mempool->group->active_pool_mask;
	/*
	 * If it is already deactivated (or not yet activated) - skip.
	 * We can do it since we always clean-up spare slab during deactivation.
	 */
	if ((mask & (UINT32_C(1) << idx)) == 0)
		return false;
	/*
	 * In case pool is active but has no data in it and features low waste
	 * we consider it to be a candidate for deactivation. Also we can't
	 * deactivate last pool.
	 */
	if (mempool_count(&small_mempool->pool) != 0)
		return false;
	if (small_mempool->waste >= small_mempool->group->waste_max / 4)
		return false;
	if (small_mempool == small_mempool->group->last)
		return false;
	return true;
}